

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::InstanceCacheKey,_void>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
::unchecked_rehash(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::InstanceCacheKey,_void>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
                   *this,arrays_type *new_arrays_)

{
  value_type_pointer ppVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  size_t num_destroyed;
  size_t local_48;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::InstanceCacheKey,_void>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
  *local_40;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::InstanceCacheKey,_void>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
  **local_38 [2];
  value_type_pointer local_28;
  arrays_type *local_20;
  undefined1 *local_18;
  
  local_18 = (undefined1 *)&local_48;
  local_48 = 0;
  local_38[0] = (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::InstanceCacheKey,_void>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
                 **)&local_28;
  local_28 = (value_type_pointer)this;
  local_20 = new_arrays_;
  for_all_elements_while<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____external_boost_unordered_hpp:6939:48)>
            (&this->arrays,(anon_class_8_1_54a39806 *)local_38);
  if (local_48 != (this->size_ctrl).size) {
    local_28 = (value_type_pointer)&local_40;
    local_40 = this;
    for_all_elements_while<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____external_boost_unordered_hpp:6939:48)>
              (&this->arrays,(anon_class_8_1_54a39806 *)&local_28);
  }
  ppVar1 = (this->arrays).elements_;
  if (ppVar1 != (value_type_pointer)0x0) {
    operator_delete(ppVar1,(this->arrays).groups_size_mask * 0x3d0 + 0x3d0 & 0xffffffffffffffc0);
  }
  sVar2 = new_arrays_->groups_size_index;
  sVar3 = new_arrays_->groups_size_mask;
  ppVar1 = new_arrays_->elements_;
  (this->arrays).groups_ = new_arrays_->groups_;
  (this->arrays).elements_ = ppVar1;
  (this->arrays).groups_size_index = sVar2;
  (this->arrays).groups_size_mask = sVar3;
  uVar4 = (this->arrays).groups_size_mask * 0xf + 0xe;
  if ((this->arrays).elements_ == (value_type_pointer)0x0) {
    uVar4 = 0;
  }
  uVar5 = (ulong)((float)uVar4 * 0.875);
  uVar5 = (long)((float)uVar4 * 0.875 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
  if (uVar4 < 0x1e) {
    uVar5 = uVar4;
  }
  (this->size_ctrl).ml = uVar5;
  return;
}

Assistant:

BOOST_NOINLINE void unchecked_rehash(arrays_type& new_arrays_) {
        std::size_t num_destroyed = 0;
        BOOST_TRY {
            for_all_elements([&, this](element_type* p) {
                nosize_transfer_element(p, new_arrays_, num_destroyed);
            });
        }